

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::ICUService::getDisplayName
          (ICUService *this,UnicodeString *id,UnicodeString *result,Locale *locale)

{
  char cVar1;
  int iVar2;
  Hashtable *this_00;
  long *plVar3;
  undefined4 extraout_var;
  long *plVar4;
  bool bVar5;
  UErrorCode status;
  Mutex mutex;
  UnicodeString us;
  UErrorCode local_84;
  Locale *local_80;
  Mutex local_78;
  UnicodeString local_70;
  
  local_84 = U_ZERO_ERROR;
  local_78.fMutex = (UMutex *)icu_63::lock;
  local_80 = locale;
  umtx_lock_63((UMutex *)icu_63::lock);
  this_00 = getVisibleIDMap(this,&local_84);
  bVar5 = true;
  if (this_00 != (Hashtable *)0x0) {
    plVar3 = (long *)Hashtable::get(this_00,id);
    if (plVar3 == (long *)0x0) {
      local_84 = U_ZERO_ERROR;
      iVar2 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0xd])(this,id);
      plVar3 = (long *)CONCAT44(extraout_var,iVar2);
      bVar5 = plVar3 == (long *)0x0;
      do {
        if (plVar3 == (long *)0x0) break;
        cVar1 = (**(code **)(*plVar3 + 0x38))(plVar3);
        if (cVar1 == '\0') {
          (**(code **)(*plVar3 + 8))(plVar3);
          bVar5 = true;
          break;
        }
        local_70.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)&PTR__UnicodeString_003e4bf0;
        local_70.fUnion.fStackFields.fLengthAndFlags = 2;
        (**(code **)(*plVar3 + 0x28))(plVar3,&local_70);
        plVar4 = (long *)Hashtable::get(this_00,&local_70);
        if (plVar4 != (long *)0x0) {
          (**(code **)(*plVar4 + 0x28))(plVar4,id,local_80,result);
          (**(code **)(*plVar3 + 8))(plVar3);
        }
        UnicodeString::~UnicodeString(&local_70);
      } while (plVar4 == (long *)0x0);
    }
    else {
      (**(code **)(*plVar3 + 0x28))(plVar3,id,local_80,result);
      bVar5 = false;
    }
  }
  Mutex::~Mutex(&local_78);
  if (bVar5) {
    UnicodeString::setToBogus(result);
  }
  return result;
}

Assistant:

UnicodeString& 
ICUService::getDisplayName(const UnicodeString& id, UnicodeString& result, const Locale& locale) const 
{
    {
        UErrorCode status = U_ZERO_ERROR;
        Mutex mutex(&lock);
        const Hashtable* map = getVisibleIDMap(status);
        if (map != NULL) {
            ICUServiceFactory* f = (ICUServiceFactory*)map->get(id);
            if (f != NULL) {
                f->getDisplayName(id, locale, result);
                return result;
            }

            // fallback
            status = U_ZERO_ERROR;
            ICUServiceKey* fallbackKey = createKey(&id, status);
            while (fallbackKey != NULL && fallbackKey->fallback()) {
                UnicodeString us;
                fallbackKey->currentID(us);
                f = (ICUServiceFactory*)map->get(us);
                if (f != NULL) {
                    f->getDisplayName(id, locale, result);
                    delete fallbackKey;
                    return result;
                }
            }
            delete fallbackKey;
        }
    }
    result.setToBogus();
    return result;
}